

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall glslang::HlslParseContext::finalizeAppendMethods(HlslParseContext *this)

{
  TIntermediate *this_00;
  TVariable *variable;
  bool bVar1;
  int iVar2;
  pointer ptVar3;
  pointer ptVar4;
  TIntermSymbol *left;
  undefined4 extraout_var;
  reference ppTVar5;
  undefined4 extraout_var_00;
  TIntermTyped *pTVar6;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *in_RSI;
  __normal_iterator<glslang::HlslParseContext::tGsAppendData_*,_std::vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>_>
  local_38;
  __normal_iterator<glslang::HlslParseContext::tGsAppendData_*,_std::vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>_>
  local_30;
  iterator append;
  TSourceLoc loc;
  HlslParseContext *this_local;
  
  TSourceLoc::init((TSourceLoc *)&append,in_RSI);
  bVar1 = std::
          vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
          ::empty(&(this->gsAppends).
                   super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
                 );
  if (!bVar1) {
    if (this->gsStreamOutput == (TVariable *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,&append,"unable to find output symbol for Append()","");
    }
    else {
      local_30._M_current =
           (tGsAppendData *)
           std::
           vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
           ::begin(&(this->gsAppends).
                    super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
                  );
      while( true ) {
        local_38._M_current =
             (tGsAppendData *)
             std::
             vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
             ::end(&(this->gsAppends).
                    super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
                  );
        bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
        if (!bVar1) break;
        ptVar3 = __gnu_cxx::
                 __normal_iterator<glslang::HlslParseContext::tGsAppendData_*,_std::vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>_>
                 ::operator->(&local_30);
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        variable = this->gsStreamOutput;
        ptVar4 = __gnu_cxx::
                 __normal_iterator<glslang::HlslParseContext::tGsAppendData_*,_std::vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>_>
                 ::operator->(&local_30);
        left = TIntermediate::addSymbol(this_00,variable,&ptVar4->loc);
        ptVar4 = __gnu_cxx::
                 __normal_iterator<glslang::HlslParseContext::tGsAppendData_*,_std::vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>_>
                 ::operator->(&local_30);
        iVar2 = (*(ptVar4->node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             CONCAT44(extraout_var,iVar2),0);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[3])();
        pTVar6 = handleAssign(this,&ptVar3->loc,EOpAssign,&left->super_TIntermTyped,
                              (TIntermTyped *)CONCAT44(extraout_var_00,iVar2));
        ptVar3 = __gnu_cxx::
                 __normal_iterator<glslang::HlslParseContext::tGsAppendData_*,_std::vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>_>
                 ::operator->(&local_30);
        iVar2 = (*(ptVar3->node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             CONCAT44(extraout_var_01,iVar2),0);
        *ppTVar5 = &pTVar6->super_TIntermNode;
        __gnu_cxx::
        __normal_iterator<glslang::HlslParseContext::tGsAppendData_*,_std::vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>_>
        ::operator++(&local_30);
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::finalizeAppendMethods()
{
    TSourceLoc loc;
    loc.init();

    // Nothing to do: bypass test for valid stream output.
    if (gsAppends.empty())
        return;

    if (gsStreamOutput == nullptr) {
        error(loc, "unable to find output symbol for Append()", "", "");
        return;
    }

    // Patch append sequences, now that we know the stream output symbol.
    for (auto append = gsAppends.begin(); append != gsAppends.end(); ++append) {
        append->node->getSequence()[0] =
            handleAssign(append->loc, EOpAssign,
                         intermediate.addSymbol(*gsStreamOutput, append->loc),
                         append->node->getSequence()[0]->getAsTyped());
    }
}